

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::TrackPid(ScriptContext *this,PropertyRecord *propertyRecord)

{
  bool bVar1;
  PropertyId propertyId;
  BOOL BVar2;
  JavascriptLibrary *this_00;
  ReferencedPropertyRecordHashSet *this_01;
  PropertyRecord *local_18;
  PropertyRecord *propertyRecord_local;
  ScriptContext *this_local;
  
  local_18 = propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  propertyId = PropertyRecord::GetPropertyId(propertyRecord);
  BVar2 = IsBuiltInPropertyId(propertyId);
  if ((BVar2 == 0) && (bVar1 = PropertyRecord::IsBound(local_18), !bVar1)) {
    this_00 = GetLibrary(this);
    this_01 = JavascriptLibrary::EnsureReferencedPropertyRecordList(this_00);
    JsUtil::
    BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::AddNew(this_01,&local_18);
  }
  return;
}

Assistant:

void ScriptContext::TrackPid(const PropertyRecord* propertyRecord)
    {
        if (IsBuiltInPropertyId(propertyRecord->GetPropertyId()) || propertyRecord->IsBound())
        {
            return;
        }

        if (-1 != this->GetLibrary()->EnsureReferencedPropertyRecordList()->AddNew(propertyRecord))
        {
            RECYCLER_PERF_COUNTER_INC(PropertyRecordBindReference);
        }
    }